

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureDataManager.cpp
# Opt level: O0

void __thiscall SecureDataManager::~SecureDataManager(SecureDataManager *this)

{
  CryptoFactory *pCVar1;
  MutexFactory *mutex;
  undefined8 *in_RDI;
  MutexFactory *this_00;
  
  *in_RDI = &PTR__SecureDataManager_00223808;
  pCVar1 = CryptoFactory::i();
  (*pCVar1->_vptr_CryptoFactory[1])(pCVar1,in_RDI[0x18]);
  this_00 = (MutexFactory *)in_RDI[0x16];
  if (this_00 != (MutexFactory *)0x0) {
    (*this_00->_vptr_MutexFactory[1])();
  }
  mutex = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,(Mutex *)mutex);
  ByteString::~ByteString((ByteString *)0x1c7eea);
  ByteString::~ByteString((ByteString *)0x1c7ef8);
  ByteString::~ByteString((ByteString *)0x1c7f06);
  ByteString::~ByteString((ByteString *)0x1c7f14);
  return;
}

Assistant:

SecureDataManager::~SecureDataManager()
{
	// Recycle the AES instance
	CryptoFactory::i()->recycleSymmetricAlgorithm(aes);

	// Clean up the mask
	delete mask;

	MutexFactory::i()->recycleMutex(dataMgrMutex);
}